

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlFeatureSetting::DebugXmlFeatures(GdlFeatureSetting *this,ofstream *strmOut,string *staPathToCur)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *in_RDX;
  ostream *in_RSI;
  GdlFeatureSetting *in_RDI;
  GrpLineAndFile lnf;
  GdlFeatureSetting *in_stack_fffffffffffffef8;
  GrpLineAndFile *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  string local_b0 [32];
  string *in_stack_ffffffffffffff70;
  GrpLineAndFile *in_stack_ffffffffffffff78;
  string local_70 [48];
  GrpLineAndFile local_40;
  ostream *local_10;
  
  local_10 = in_RSI;
  GdlObject::LineAndFile(&in_RDI->super_GdlObject);
  GrpLineAndFile::GrpLineAndFile
            ((GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  poVar3 = std::operator<<(local_10,"      <featureSetting name=\"");
  Name_abi_cxx11_(in_stack_fffffffffffffef8);
  poVar3 = std::operator<<(poVar3,local_70);
  poVar3 = std::operator<<(poVar3,"\" value=\"");
  iVar2 = Value(in_RDI);
  std::ostream::operator<<(poVar3,iVar2);
  std::__cxx11::string::~string(local_70);
  bVar1 = GrpLineAndFile::NotSet(&local_40);
  if (!bVar1) {
    poVar3 = std::operator<<(local_10,"\" inFile=\"");
    std::__cxx11::string::string(local_b0,in_RDX);
    GrpLineAndFile::FileWithPath(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff70);
    poVar3 = std::operator<<(poVar3,"\" atLine=\"");
    iVar2 = GrpLineAndFile::OriginalLine(&local_40);
    std::ostream::operator<<(poVar3,iVar2);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string(local_b0);
  }
  std::operator<<(local_10,"\" />\n");
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1241ff);
  return;
}

Assistant:

void GdlFeatureSetting::DebugXmlFeatures(std::ofstream & strmOut, std::string staPathToCur)
{
	GrpLineAndFile lnf = this->LineAndFile();
	strmOut << "      <featureSetting name=\"" << this->Name()
		<< "\" value=\"" << this->Value();

	if (!lnf.NotSet())
		strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
			<< "\" atLine=\"" << lnf.OriginalLine();

	strmOut << "\" />\n";
}